

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# RestReader.cpp
# Opt level: O1

void __thiscall OpenMD::RestReader::readSet(RestReader *this)

{
  char *__s;
  istream *inputStream;
  char *pcVar1;
  long lVar2;
  string line;
  undefined1 *local_50;
  char *local_48;
  undefined1 local_40;
  undefined7 uStack_3f;
  
  local_48 = (char *)0x0;
  local_40 = 0;
  local_50 = &local_40;
  std::ios::clear((int)this->inFile_ + (int)this->inFile_->_vptr_basic_istream[-3]);
  std::istream::seekg(this->inFile_,this->framePos_,0);
  inputStream = this->inFile_;
  std::ios::widen((char)inputStream->_vptr_basic_istream[-3] + (char)inputStream);
  __s = this->buffer;
  std::istream::getline((char *)inputStream,(long)__s,'\0');
  pcVar1 = local_48;
  strlen(__s);
  std::__cxx11::string::_M_replace((ulong)&local_50,0,pcVar1,(ulong)__s);
  lVar2 = std::__cxx11::string::find((char *)&local_50,0x296a7a,0);
  if (lVar2 == -1) {
    builtin_strncpy(painCave.errMsg + 0x20,"Snapshot>\n",0xb);
    builtin_strncpy(painCave.errMsg + 0x10,": can not find <",0x10);
    builtin_strncpy(painCave.errMsg,"RestReader Error",0x10);
    painCave.isFatal = 1;
    simError();
  }
  readFrameProperties(this,inputStream);
  readStuntDoubles(this,inputStream);
  std::ios::widen((char)inputStream->_vptr_basic_istream[-3] + (char)inputStream);
  std::istream::getline((char *)inputStream,(long)__s,'\0');
  pcVar1 = local_48;
  strlen(__s);
  std::__cxx11::string::_M_replace((ulong)&local_50,0,pcVar1,(ulong)__s);
  lVar2 = std::__cxx11::string::find((char *)&local_50,0x296ac1,0);
  if (lVar2 == -1) {
    builtin_strncpy(painCave.errMsg + 0x20,"/Snapshot>\n",0xc);
    builtin_strncpy(painCave.errMsg + 0x10,": can not find <",0x10);
    builtin_strncpy(painCave.errMsg,"RestReader Error",0x10);
    painCave.isFatal = 1;
    simError();
  }
  if (local_50 != &local_40) {
    operator_delete(local_50,CONCAT71(uStack_3f,local_40) + 1);
  }
  return;
}

Assistant:

void RestReader::readSet() {
    std::string line;

#ifndef IS_MPI

    inFile_->clear();
    inFile_->seekg(framePos_);

    std::istream& inputStream = *inFile_;
#else

    int primaryNode = 0;
    std::stringstream sstream;
    if (worldRank == primaryNode) {
      std::string sendBuffer;

      inFile_->clear();
      inFile_->seekg(framePos_);

      while (inFile_->getline(buffer, bufferSize)) {
        line = buffer;
        sendBuffer += line;
        sendBuffer += '\n';
        if (line.find("</Snapshot>") != std::string::npos) { break; }
      }

      int sendBufferSize = sendBuffer.size();
      MPI_Bcast(&sendBufferSize, 1, MPI_INT, primaryNode, MPI_COMM_WORLD);
      MPI_Bcast((void*)sendBuffer.c_str(), sendBufferSize, MPI_CHAR,
                primaryNode, MPI_COMM_WORLD);

      sstream.str(sendBuffer);
    } else {
      int sendBufferSize;
      MPI_Bcast(&sendBufferSize, 1, MPI_INT, primaryNode, MPI_COMM_WORLD);
      char* recvBuffer = new char[sendBufferSize + 1];
      assert(recvBuffer);
      recvBuffer[sendBufferSize] = '\0';
      MPI_Bcast(recvBuffer, sendBufferSize, MPI_CHAR, primaryNode,
                MPI_COMM_WORLD);
      sstream.str(recvBuffer);
      delete[] recvBuffer;
    }

    std::istream& inputStream = sstream;
#endif

    inputStream.getline(buffer, bufferSize);

    line = buffer;
    if (line.find("<Snapshot>") == std::string::npos) {
      snprintf(painCave.errMsg, MAX_SIM_ERROR_MSG_LENGTH,
               "RestReader Error: can not find <Snapshot>\n");
      painCave.isFatal = 1;
      simError();
    }

    // read frameData
    readFrameProperties(inputStream);

    // read StuntDoubles
    readStuntDoubles(inputStream);

    inputStream.getline(buffer, bufferSize);
    line = buffer;
    if (line.find("</Snapshot>") == std::string::npos) {
      snprintf(painCave.errMsg, MAX_SIM_ERROR_MSG_LENGTH,
               "RestReader Error: can not find </Snapshot>\n");
      painCave.isFatal = 1;
      simError();
    }
  }